

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O2

int run_test_udp_alloc_cb_fail(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  sockaddr_in addr;
  uv_buf_t local_158;
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_udp_bind(&server,(sockaddr *)&addr,0);
      if (iVar1 == 0) {
        iVar1 = uv_udp_recv_start(&server,sv_alloc_cb,sv_recv_cb);
        if (iVar1 == 0) {
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_udp_init(puVar2,&client);
            if (iVar1 == 0) {
              local_158 = uv_buf_init("PING",4);
              iVar1 = uv_udp_send(&req,&client,&local_158,1,(sockaddr *)&addr,cl_send_cb);
              if (iVar1 == 0) {
                if (close_cb_called == 0) {
                  if (cl_send_cb_called == 0) {
                    if (cl_recv_cb_called == 0) {
                      if (sv_send_cb_called == 0) {
                        if (sv_recv_cb_called == 0) {
                          puVar2 = uv_default_loop();
                          uv_run(puVar2,UV_RUN_DEFAULT);
                          if (cl_send_cb_called == 1) {
                            if (cl_recv_cb_called == 1) {
                              if (sv_send_cb_called == 1) {
                                if (sv_recv_cb_called == 1) {
                                  if (close_cb_called == 2) {
                                    puVar2 = uv_default_loop();
                                    uv_walk(puVar2,close_walk_cb,(void *)0x0);
                                    uv_run(puVar2,UV_RUN_DEFAULT);
                                    puVar2 = uv_default_loop();
                                    iVar1 = uv_loop_close(puVar2);
                                    if (iVar1 == 0) {
                                      return 0;
                                    }
                                    pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                                    uVar3 = 0xc2;
                                  }
                                  else {
                                    pcVar4 = "close_cb_called == 2";
                                    uVar3 = 0xc0;
                                  }
                                }
                                else {
                                  pcVar4 = "sv_recv_cb_called == 1";
                                  uVar3 = 0xbf;
                                }
                              }
                              else {
                                pcVar4 = "sv_send_cb_called == 1";
                                uVar3 = 0xbe;
                              }
                            }
                            else {
                              pcVar4 = "cl_recv_cb_called == 1";
                              uVar3 = 0xbd;
                            }
                          }
                          else {
                            pcVar4 = "cl_send_cb_called == 1";
                            uVar3 = 0xbc;
                          }
                        }
                        else {
                          pcVar4 = "sv_recv_cb_called == 0";
                          uVar3 = 0xb8;
                        }
                      }
                      else {
                        pcVar4 = "sv_send_cb_called == 0";
                        uVar3 = 0xb7;
                      }
                    }
                    else {
                      pcVar4 = "cl_recv_cb_called == 0";
                      uVar3 = 0xb6;
                    }
                  }
                  else {
                    pcVar4 = "cl_send_cb_called == 0";
                    uVar3 = 0xb5;
                  }
                }
                else {
                  pcVar4 = "close_cb_called == 0";
                  uVar3 = 0xb4;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0xb2;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0xa9;
            }
          }
          else {
            pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
            uVar3 = 0xa6;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0xa4;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0xa1;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x9e;
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uVar3 = 0x9b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-alloc-cb-fail.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(udp_alloc_cb_fail) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, sv_alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_send_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);
  ASSERT(sv_recv_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_send_cb_called == 1);
  ASSERT(cl_recv_cb_called == 1);
  ASSERT(sv_send_cb_called == 1);
  ASSERT(sv_recv_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}